

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O1

void secp256k1_fe_from_signed62(secp256k1_fe *r,secp256k1_modinv64_signed62 *a)

{
  byte bVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  secp256k1_ge *psVar42;
  int iVar43;
  secp256k1_ge *r_00;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong extraout_RDX;
  long lVar49;
  ulong extraout_RDX_00;
  secp256k1_ge *a_00;
  secp256k1_ge *a_01;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  byte bVar61;
  undefined1 auStack_100 [64];
  byte abStack_c0 [32];
  byte abStack_a0 [32];
  undefined1 auStack_80 [16];
  uint64_t uStack_70;
  uint64_t uStack_68;
  undefined1 auStack_60 [16];
  uint64_t uStack_50;
  uint64_t uStack_48;
  
  bVar61 = 0;
  uVar39 = a->v[0];
  if (uVar39 >> 0x3e == 0) {
    uVar40 = a->v[1];
    if (0x3fffffffffffffff < uVar40) goto LAB_0014ea8c;
    uVar41 = a->v[2];
    if (0x3fffffffffffffff < uVar41) goto LAB_0014ea91;
    uVar38 = a->v[3];
    if (0x3fffffffffffffff < uVar38) goto LAB_0014ea96;
    uVar50 = a->v[4];
    if (uVar50 < 0x100) {
      r->n[0] = uVar39 & 0xfffffffffffff;
      r->n[1] = (uVar40 & 0x3ffffffffff) << 10 | uVar39 >> 0x34;
      r->n[2] = (uVar41 & 0xffffffff) << 0x14 | uVar40 >> 0x2a;
      r->n[3] = (ulong)((uint)uVar38 & 0x3fffff) << 0x1e | uVar41 >> 0x20;
      r->n[4] = uVar50 << 0x28 | uVar38 >> 0x16;
      return;
    }
  }
  else {
    secp256k1_fe_from_signed62_cold_5();
LAB_0014ea8c:
    secp256k1_fe_from_signed62_cold_4();
LAB_0014ea91:
    secp256k1_fe_from_signed62_cold_3();
LAB_0014ea96:
    secp256k1_fe_from_signed62_cold_2();
  }
  secp256k1_fe_from_signed62_cold_1();
  a_00 = (secp256k1_ge *)a;
  a_01 = r_00;
  secp256k1_scalar_verify((secp256k1_scalar *)r_00);
  if ((secp256k1_ge *)r == r_00) {
    secp256k1_scalar_split_lambda_cold_6();
LAB_0014f023:
    secp256k1_scalar_split_lambda_cold_5();
LAB_0014f028:
    secp256k1_scalar_split_lambda_cold_4();
LAB_0014f02d:
    secp256k1_scalar_split_lambda_cold_3();
  }
  else {
    if ((secp256k1_ge *)a == r_00) goto LAB_0014f023;
    if (r == (secp256k1_fe *)a) goto LAB_0014f028;
    secp256k1_scalar_verify((secp256k1_scalar *)r_00);
    secp256k1_scalar_verify(&secp256k1_scalar_split_lambda::g1);
    uVar39 = (r_00->x).n[0];
    uVar40 = (r_00->x).n[1];
    uVar41 = (r_00->x).n[2];
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar39;
    uVar44 = SUB168(auVar3 * ZEXT816(0xe893209a45dbb031),8);
    auVar36._8_8_ = 0;
    auVar36._0_8_ = uVar44;
    auStack_100._0_8_ = SUB168(auVar3 * ZEXT816(0xe893209a45dbb031),0);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar39;
    auVar4 = auVar4 * ZEXT816(0x3daa8a1471e8ca7f);
    uVar50 = SUB168(auVar4 + auVar36,0);
    uVar55 = SUB168(auVar4 + auVar36,8);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar40;
    uVar45 = SUB168(auVar5 * ZEXT816(0xe893209a45dbb031),8);
    uVar38 = SUB168(auVar5 * ZEXT816(0xe893209a45dbb031),0);
    auStack_100._8_8_ = uVar50 + uVar38;
    uVar38 = (ulong)CARRY8(uVar50,uVar38);
    uVar50 = uVar55 + uVar45;
    uVar56 = uVar50 + uVar38;
    uVar57 = (ulong)CARRY8(auVar4._8_8_,(ulong)CARRY8(uVar44,auVar4._0_8_)) +
             (ulong)(CARRY8(uVar55,uVar45) || CARRY8(uVar50,uVar38));
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar39;
    uVar46 = SUB168(auVar6 * ZEXT816(0xe86c90e49284eb15),8);
    uVar38 = SUB168(auVar6 * ZEXT816(0xe86c90e49284eb15),0);
    uVar44 = uVar56 + uVar38;
    uVar38 = (ulong)CARRY8(uVar56,uVar38);
    uVar45 = uVar57 + uVar46;
    uVar58 = uVar45 + uVar38;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar40;
    uVar47 = SUB168(auVar7 * ZEXT816(0x3daa8a1471e8ca7f),8);
    uVar50 = SUB168(auVar7 * ZEXT816(0x3daa8a1471e8ca7f),0);
    uVar56 = uVar44 + uVar50;
    uVar50 = (ulong)CARRY8(uVar44,uVar50);
    uVar55 = uVar58 + uVar47;
    uVar59 = uVar55 + uVar50;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar41;
    uVar48 = SUB168(auVar8 * ZEXT816(0xe893209a45dbb031),8);
    uVar44 = SUB168(auVar8 * ZEXT816(0xe893209a45dbb031),0);
    auStack_100._16_8_ = uVar56 + uVar44;
    uVar44 = (ulong)CARRY8(uVar56,uVar44);
    uVar56 = uVar59 + uVar48;
    uVar60 = uVar56 + uVar44;
    uVar51 = (ulong)(CARRY8(uVar57,uVar46) || CARRY8(uVar45,uVar38)) +
             (ulong)(CARRY8(uVar58,uVar47) || CARRY8(uVar55,uVar50)) +
             (ulong)(CARRY8(uVar59,uVar48) || CARRY8(uVar56,uVar44));
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar39;
    uVar48 = SUB168(auVar9 * ZEXT816(0x3086d221a7d46bcd),8);
    uVar39 = SUB168(auVar9 * ZEXT816(0x3086d221a7d46bcd),0);
    uVar44 = uVar60 + uVar39;
    uVar38 = (ulong)CARRY8(uVar60,uVar39);
    uVar55 = uVar51 + uVar48;
    uVar60 = uVar55 + uVar38;
    uVar39 = (r_00->x).n[3];
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar40;
    uVar57 = SUB168(auVar10 * ZEXT816(0xe86c90e49284eb15),8);
    uVar50 = SUB168(auVar10 * ZEXT816(0xe86c90e49284eb15),0);
    uVar45 = uVar44 + uVar50;
    uVar50 = (ulong)CARRY8(uVar44,uVar50);
    uVar56 = uVar60 + uVar57;
    uVar52 = uVar56 + uVar50;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar41;
    uVar58 = SUB168(auVar11 * ZEXT816(0x3daa8a1471e8ca7f),8);
    uVar44 = SUB168(auVar11 * ZEXT816(0x3daa8a1471e8ca7f),0);
    uVar47 = uVar45 + uVar44;
    uVar44 = (ulong)CARRY8(uVar45,uVar44);
    uVar46 = uVar52 + uVar58;
    uVar53 = uVar46 + uVar44;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar39;
    uVar59 = SUB168(auVar12 * ZEXT816(0xe893209a45dbb031),8);
    uVar45 = SUB168(auVar12 * ZEXT816(0xe893209a45dbb031),0);
    auStack_100._24_8_ = uVar47 + uVar45;
    uVar45 = (ulong)CARRY8(uVar47,uVar45);
    uVar47 = uVar53 + uVar59;
    uVar54 = uVar47 + uVar45;
    uVar48 = (ulong)(CARRY8(uVar51,uVar48) || CARRY8(uVar55,uVar38)) +
             (ulong)(CARRY8(uVar60,uVar57) || CARRY8(uVar56,uVar50)) +
             (ulong)(CARRY8(uVar52,uVar58) || CARRY8(uVar46,uVar44)) +
             (ulong)(CARRY8(uVar53,uVar59) || CARRY8(uVar47,uVar45));
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar40;
    uVar56 = SUB168(auVar13 * ZEXT816(0x3086d221a7d46bcd),8);
    uVar40 = SUB168(auVar13 * ZEXT816(0x3086d221a7d46bcd),0);
    uVar50 = uVar54 + uVar40;
    uVar40 = (ulong)CARRY8(uVar54,uVar40);
    uVar44 = uVar48 + uVar56;
    uVar57 = uVar44 + uVar40;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar41;
    uVar46 = SUB168(auVar14 * ZEXT816(0xe86c90e49284eb15),8);
    uVar38 = SUB168(auVar14 * ZEXT816(0xe86c90e49284eb15),0);
    uVar55 = uVar50 + uVar38;
    uVar38 = (ulong)CARRY8(uVar50,uVar38);
    uVar45 = uVar57 + uVar46;
    uVar58 = uVar45 + uVar38;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = uVar39;
    uVar47 = SUB168(auVar15 * ZEXT816(0x3daa8a1471e8ca7f),8);
    uVar50 = SUB168(auVar15 * ZEXT816(0x3daa8a1471e8ca7f),0);
    auStack_100._32_8_ = uVar55 + uVar50;
    uVar50 = (ulong)CARRY8(uVar55,uVar50);
    uVar55 = uVar58 + uVar47;
    uVar59 = uVar55 + uVar50;
    uVar55 = (ulong)(CARRY8(uVar48,uVar56) || CARRY8(uVar44,uVar40)) +
             (ulong)(CARRY8(uVar57,uVar46) || CARRY8(uVar45,uVar38)) +
             (ulong)(CARRY8(uVar58,uVar47) || CARRY8(uVar55,uVar50));
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar41;
    uVar44 = SUB168(auVar16 * ZEXT816(0x3086d221a7d46bcd),8);
    uVar40 = SUB168(auVar16 * ZEXT816(0x3086d221a7d46bcd),0);
    uVar50 = uVar59 + uVar40;
    uVar40 = (ulong)CARRY8(uVar59,uVar40);
    uVar38 = uVar55 + uVar44;
    uVar56 = uVar38 + uVar40;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar39;
    uVar45 = SUB168(auVar17 * ZEXT816(0xe86c90e49284eb15),8);
    uVar41 = SUB168(auVar17 * ZEXT816(0xe86c90e49284eb15),0);
    auStack_100._40_8_ = uVar50 + uVar41;
    uVar41 = (ulong)CARRY8(uVar50,uVar41);
    uVar50 = uVar56 + uVar45;
    auStack_100._56_8_ =
         (ulong)(CARRY8(uVar55,uVar44) || CARRY8(uVar38,uVar40)) +
         (ulong)(CARRY8(uVar56,uVar45) || CARRY8(uVar50,uVar41));
    auStack_100._48_8_ = uVar50 + uVar41;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar39;
    auStack_100._48_16_ = auVar18 * ZEXT816(0x3086d221a7d46bcd) + auStack_100._48_16_;
    uStack_70 = 0;
    uStack_68 = 0;
    auStack_80 = auStack_100._48_16_;
    secp256k1_scalar_cadd_bit
              ((secp256k1_scalar *)auStack_80,0,(uint)((ulong)auStack_100._40_8_ >> 0x3f));
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_80);
    secp256k1_scalar_verify((secp256k1_scalar *)r_00);
    secp256k1_scalar_verify(&secp256k1_scalar_split_lambda::g2);
    uVar39 = (r_00->x).n[0];
    uVar40 = (r_00->x).n[1];
    uVar41 = (r_00->x).n[2];
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar39;
    uVar44 = SUB168(auVar19 * ZEXT816(0x1571b4ae8ac47f71),8);
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar44;
    auStack_100._0_8_ = SUB168(auVar19 * ZEXT816(0x1571b4ae8ac47f71),0);
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar39;
    auVar20 = auVar20 * ZEXT816(0x221208ac9df506c6);
    uVar50 = SUB168(auVar20 + auVar37,0);
    uVar55 = SUB168(auVar20 + auVar37,8);
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar40;
    uVar45 = SUB168(auVar21 * ZEXT816(0x1571b4ae8ac47f71),8);
    uVar38 = SUB168(auVar21 * ZEXT816(0x1571b4ae8ac47f71),0);
    auStack_100._8_8_ = uVar50 + uVar38;
    uVar38 = (ulong)CARRY8(uVar50,uVar38);
    uVar50 = uVar55 + uVar45;
    uVar56 = uVar50 + uVar38;
    uVar57 = (ulong)CARRY8(auVar20._8_8_,(ulong)CARRY8(uVar44,auVar20._0_8_)) +
             (ulong)(CARRY8(uVar55,uVar45) || CARRY8(uVar50,uVar38));
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar39;
    uVar46 = SUB168(auVar22 * ZEXT816(0x6f547fa90abfe4c4),8);
    uVar38 = SUB168(auVar22 * ZEXT816(0x6f547fa90abfe4c4),0);
    uVar44 = uVar56 + uVar38;
    uVar38 = (ulong)CARRY8(uVar56,uVar38);
    uVar45 = uVar57 + uVar46;
    uVar58 = uVar45 + uVar38;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = uVar40;
    uVar47 = SUB168(auVar23 * ZEXT816(0x221208ac9df506c6),8);
    uVar50 = SUB168(auVar23 * ZEXT816(0x221208ac9df506c6),0);
    uVar56 = uVar44 + uVar50;
    uVar50 = (ulong)CARRY8(uVar44,uVar50);
    uVar55 = uVar58 + uVar47;
    uVar59 = uVar55 + uVar50;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = uVar41;
    uVar48 = SUB168(auVar24 * ZEXT816(0x1571b4ae8ac47f71),8);
    uVar44 = SUB168(auVar24 * ZEXT816(0x1571b4ae8ac47f71),0);
    auStack_100._16_8_ = uVar56 + uVar44;
    uVar44 = (ulong)CARRY8(uVar56,uVar44);
    uVar56 = uVar59 + uVar48;
    uVar60 = uVar56 + uVar44;
    uVar51 = (ulong)(CARRY8(uVar57,uVar46) || CARRY8(uVar45,uVar38)) +
             (ulong)(CARRY8(uVar58,uVar47) || CARRY8(uVar55,uVar50)) +
             (ulong)(CARRY8(uVar59,uVar48) || CARRY8(uVar56,uVar44));
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar39;
    uVar48 = SUB168(auVar25 * ZEXT816(0xe4437ed6010e8828),8);
    uVar39 = SUB168(auVar25 * ZEXT816(0xe4437ed6010e8828),0);
    uVar44 = uVar60 + uVar39;
    uVar38 = (ulong)CARRY8(uVar60,uVar39);
    uVar55 = uVar51 + uVar48;
    uVar60 = uVar55 + uVar38;
    uVar39 = (r_00->x).n[3];
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar40;
    uVar57 = SUB168(auVar26 * ZEXT816(0x6f547fa90abfe4c4),8);
    uVar50 = SUB168(auVar26 * ZEXT816(0x6f547fa90abfe4c4),0);
    uVar45 = uVar44 + uVar50;
    uVar50 = (ulong)CARRY8(uVar44,uVar50);
    uVar56 = uVar60 + uVar57;
    uVar52 = uVar56 + uVar50;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar41;
    uVar58 = SUB168(auVar27 * ZEXT816(0x221208ac9df506c6),8);
    uVar44 = SUB168(auVar27 * ZEXT816(0x221208ac9df506c6),0);
    uVar47 = uVar45 + uVar44;
    uVar44 = (ulong)CARRY8(uVar45,uVar44);
    uVar46 = uVar52 + uVar58;
    uVar53 = uVar46 + uVar44;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = uVar39;
    uVar59 = SUB168(auVar28 * ZEXT816(0x1571b4ae8ac47f71),8);
    uVar45 = SUB168(auVar28 * ZEXT816(0x1571b4ae8ac47f71),0);
    auStack_100._24_8_ = uVar47 + uVar45;
    uVar45 = (ulong)CARRY8(uVar47,uVar45);
    uVar47 = uVar53 + uVar59;
    uVar54 = uVar47 + uVar45;
    uVar48 = (ulong)(CARRY8(uVar51,uVar48) || CARRY8(uVar55,uVar38)) +
             (ulong)(CARRY8(uVar60,uVar57) || CARRY8(uVar56,uVar50)) +
             (ulong)(CARRY8(uVar52,uVar58) || CARRY8(uVar46,uVar44)) +
             (ulong)(CARRY8(uVar53,uVar59) || CARRY8(uVar47,uVar45));
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar40;
    uVar56 = SUB168(auVar29 * ZEXT816(0xe4437ed6010e8828),8);
    uVar40 = SUB168(auVar29 * ZEXT816(0xe4437ed6010e8828),0);
    uVar50 = uVar54 + uVar40;
    uVar40 = (ulong)CARRY8(uVar54,uVar40);
    uVar44 = uVar48 + uVar56;
    uVar57 = uVar44 + uVar40;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar41;
    uVar46 = SUB168(auVar30 * ZEXT816(0x6f547fa90abfe4c4),8);
    uVar38 = SUB168(auVar30 * ZEXT816(0x6f547fa90abfe4c4),0);
    uVar55 = uVar50 + uVar38;
    uVar38 = (ulong)CARRY8(uVar50,uVar38);
    uVar45 = uVar57 + uVar46;
    uVar58 = uVar45 + uVar38;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar39;
    uVar47 = SUB168(auVar31 * ZEXT816(0x221208ac9df506c6),8);
    uVar50 = SUB168(auVar31 * ZEXT816(0x221208ac9df506c6),0);
    auStack_100._32_8_ = uVar55 + uVar50;
    uVar50 = (ulong)CARRY8(uVar55,uVar50);
    uVar55 = uVar58 + uVar47;
    uVar59 = uVar55 + uVar50;
    uVar55 = (ulong)(CARRY8(uVar48,uVar56) || CARRY8(uVar44,uVar40)) +
             (ulong)(CARRY8(uVar57,uVar46) || CARRY8(uVar45,uVar38)) +
             (ulong)(CARRY8(uVar58,uVar47) || CARRY8(uVar55,uVar50));
    auVar32._8_8_ = 0;
    auVar32._0_8_ = uVar41;
    uVar44 = SUB168(auVar32 * ZEXT816(0xe4437ed6010e8828),8);
    uVar40 = SUB168(auVar32 * ZEXT816(0xe4437ed6010e8828),0);
    uVar50 = uVar59 + uVar40;
    uVar40 = (ulong)CARRY8(uVar59,uVar40);
    uVar38 = uVar55 + uVar44;
    uVar56 = uVar38 + uVar40;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar39;
    uVar45 = SUB168(auVar33 * ZEXT816(0x6f547fa90abfe4c4),8);
    uVar41 = SUB168(auVar33 * ZEXT816(0x6f547fa90abfe4c4),0);
    auStack_100._40_8_ = uVar50 + uVar41;
    uVar41 = (ulong)CARRY8(uVar50,uVar41);
    uVar50 = uVar56 + uVar45;
    auVar35._8_8_ =
         (ulong)(CARRY8(uVar55,uVar44) || CARRY8(uVar38,uVar40)) +
         (ulong)(CARRY8(uVar56,uVar45) || CARRY8(uVar50,uVar41));
    auVar35._0_8_ = uVar50 + uVar41;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar39;
    auStack_100._48_16_ = auVar34 * ZEXT816(0xe4437ed6010e8828) + auVar35;
    uStack_50 = 0;
    uStack_48 = 0;
    auStack_60 = auStack_100._48_16_;
    secp256k1_scalar_cadd_bit
              ((secp256k1_scalar *)auStack_60,0,(uint)((ulong)auStack_100._40_8_ >> 0x3f));
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_60);
    secp256k1_scalar_mul
              ((secp256k1_scalar *)auStack_80,(secp256k1_scalar *)auStack_80,
               &secp256k1_scalar_split_lambda::minus_b1);
    secp256k1_scalar_mul
              ((secp256k1_scalar *)auStack_60,(secp256k1_scalar *)auStack_60,
               &secp256k1_scalar_split_lambda::minus_b2);
    secp256k1_scalar_add
              ((secp256k1_scalar *)a,(secp256k1_scalar *)auStack_80,(secp256k1_scalar *)auStack_60);
    secp256k1_scalar_mul((secp256k1_scalar *)r,(secp256k1_scalar *)a,&secp256k1_const_lambda);
    secp256k1_scalar_negate((secp256k1_scalar *)r,(secp256k1_scalar *)r);
    secp256k1_scalar_add((secp256k1_scalar *)r,(secp256k1_scalar *)r,(secp256k1_scalar *)r_00);
    secp256k1_scalar_verify((secp256k1_scalar *)r);
    secp256k1_scalar_verify((secp256k1_scalar *)a);
    secp256k1_scalar_mul
              ((secp256k1_scalar *)auStack_100,&secp256k1_const_lambda,(secp256k1_scalar *)a);
    a_00 = (secp256k1_ge *)auStack_100;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_100,(secp256k1_scalar *)auStack_100,(secp256k1_scalar *)r
              );
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_100);
    a_01 = r_00;
    secp256k1_scalar_verify((secp256k1_scalar *)r_00);
    if ((((auStack_100._0_8_ != (r_00->x).n[0]) || (auStack_100._8_8_ != (r_00->x).n[1])) ||
        (auStack_100._16_8_ != (r_00->x).n[2])) || (auStack_100._24_8_ != (r_00->x).n[3]))
    goto LAB_0014f02d;
    secp256k1_scalar_negate((secp256k1_scalar *)auStack_100,(secp256k1_scalar *)r);
    secp256k1_scalar_get_b32(abStack_a0,(secp256k1_scalar *)r);
    secp256k1_scalar_get_b32(abStack_c0,(secp256k1_scalar *)auStack_100);
    psVar42 = (secp256k1_ge *)0x0;
    uVar39 = extraout_RDX;
    do {
      uVar40 = uVar39 & 0xffffffff;
      bVar1 = abStack_a0[(long)psVar42];
      bVar2 = (byte)psVar42[0x3f8d].x.n[1];
      uVar39 = (ulong)((uint)bVar1 - (uint)bVar2);
      if (bVar1 == bVar2) {
        uVar39 = uVar40;
      }
      iVar43 = (int)uVar39;
      if (bVar1 != bVar2) goto LAB_0014ef55;
      psVar42 = (secp256k1_ge *)((long)(psVar42->x).n + 1);
    } while (psVar42 != (secp256k1_ge *)0x20);
    iVar43 = 0;
LAB_0014ef55:
    if (iVar43 < 0) {
LAB_0014ef87:
      secp256k1_scalar_negate((secp256k1_scalar *)auStack_100,(secp256k1_scalar *)a);
      secp256k1_scalar_get_b32(abStack_a0,(secp256k1_scalar *)a);
      secp256k1_scalar_get_b32(abStack_c0,(secp256k1_scalar *)auStack_100);
      psVar42 = (secp256k1_ge *)0x0;
      uVar39 = extraout_RDX_00;
      do {
        uVar40 = uVar39 & 0xffffffff;
        bVar1 = abStack_a0[(long)psVar42];
        bVar2 = (byte)psVar42[0x3f8d].x.magnitude;
        uVar39 = (ulong)((uint)bVar1 - (uint)bVar2);
        if (bVar1 == bVar2) {
          uVar39 = uVar40;
        }
        iVar43 = (int)uVar39;
        if (bVar1 != bVar2) goto LAB_0014efde;
        psVar42 = (secp256k1_ge *)((long)(psVar42->x).n + 1);
      } while (psVar42 != (secp256k1_ge *)0x20);
      iVar43 = 0;
LAB_0014efde:
      if (iVar43 < 0) {
        return;
      }
      lVar49 = 0;
      do {
        a_00 = (secp256k1_ge *)((ulong)psVar42 & 0xffffffff);
        bVar1 = abStack_c0[lVar49];
        a_01 = (secp256k1_ge *)(ulong)bVar1;
        bVar2 = (&secp256k1_scalar_split_lambda_verify_k2_bound)[lVar49];
        psVar42 = (secp256k1_ge *)(ulong)((uint)bVar1 - (uint)bVar2);
        if (bVar1 == bVar2) {
          psVar42 = a_00;
        }
        iVar43 = (int)psVar42;
        if (bVar1 != bVar2) goto LAB_0014f008;
        lVar49 = lVar49 + 1;
      } while (lVar49 != 0x20);
      iVar43 = 0;
LAB_0014f008:
      if (iVar43 < 0) {
        return;
      }
      goto LAB_0014f037;
    }
    lVar49 = 0;
    do {
      a_00 = (secp256k1_ge *)((ulong)psVar42 & 0xffffffff);
      bVar1 = abStack_c0[lVar49];
      a_01 = (secp256k1_ge *)(ulong)bVar1;
      bVar2 = (&secp256k1_scalar_split_lambda_verify_k1_bound)[lVar49];
      psVar42 = (secp256k1_ge *)(ulong)((uint)bVar1 - (uint)bVar2);
      if (bVar1 == bVar2) {
        psVar42 = a_00;
      }
      iVar43 = (int)psVar42;
      if (bVar1 != bVar2) goto LAB_0014ef7f;
      lVar49 = lVar49 + 1;
    } while (lVar49 != 0x20);
    iVar43 = 0;
LAB_0014ef7f:
    if (iVar43 < 0) goto LAB_0014ef87;
  }
  secp256k1_scalar_split_lambda_cold_1();
LAB_0014f037:
  secp256k1_scalar_split_lambda_cold_2();
  secp256k1_ge_verify(a_00);
  psVar42 = a_01;
  for (lVar49 = 0xd; lVar49 != 0; lVar49 = lVar49 + -1) {
    (psVar42->x).n[0] = (a_00->x).n[0];
    a_00 = (secp256k1_ge *)((long)a_00 + (ulong)bVar61 * -0x10 + 8);
    psVar42 = (secp256k1_ge *)((long)psVar42 + (ulong)bVar61 * -0x10 + 8);
  }
  secp256k1_fe_mul(&a_01->x,&a_01->x,&secp256k1_const_beta);
  secp256k1_ge_verify(a_01);
  return;
}

Assistant:

static void secp256k1_fe_from_signed62(secp256k1_fe *r, const secp256k1_modinv64_signed62 *a) {
    const uint64_t M52 = UINT64_MAX >> 12;
    const uint64_t a0 = a->v[0], a1 = a->v[1], a2 = a->v[2], a3 = a->v[3], a4 = a->v[4];

    /* The output from secp256k1_modinv64{_var} should be normalized to range [0,modulus), and
     * have limbs in [0,2^62). The modulus is < 2^256, so the top limb must be below 2^(256-62*4).
     */
    VERIFY_CHECK(a0 >> 62 == 0);
    VERIFY_CHECK(a1 >> 62 == 0);
    VERIFY_CHECK(a2 >> 62 == 0);
    VERIFY_CHECK(a3 >> 62 == 0);
    VERIFY_CHECK(a4 >> 8 == 0);

    r->n[0] =  a0                   & M52;
    r->n[1] = (a0 >> 52 | a1 << 10) & M52;
    r->n[2] = (a1 >> 42 | a2 << 20) & M52;
    r->n[3] = (a2 >> 32 | a3 << 30) & M52;
    r->n[4] = (a3 >> 22 | a4 << 40);
}